

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

string * testing::internal::edit_distance::CreateUnifiedDiff
                   (string *__return_storage_ptr__,
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *left,vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *right,size_t context)

{
  uint uVar1;
  _List_node_base *p_Var2;
  char *__s;
  undefined8 *puVar3;
  long *plVar4;
  bool bVar5;
  bool bVar6;
  undefined8 *puVar7;
  _List_node_base *p_Var8;
  ostream *poVar9;
  size_t sVar10;
  ulong uVar11;
  long lVar12;
  size_t i;
  size_t sVar13;
  char edit;
  ulong uVar14;
  pointer pEVar15;
  pointer pEVar16;
  long *plVar17;
  ulong uVar18;
  ulong uVar19;
  long lVar20;
  ulong uVar21;
  ulong uVar22;
  stringstream local_278 [8];
  stringstream ss;
  undefined1 local_d8 [8];
  Hunk hunk;
  vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
  edits;
  char local_31;
  
  ss._384_8_ = right;
  CalculateOptimalEdits
            ((vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
              *)&hunk.hunk_removes_.
                 super__List_base<std::pair<char,_const_char_*>,_std::allocator<std::pair<char,_const_char_*>_>_>
                 ._M_impl._M_node._M_size,left,right);
  std::__cxx11::stringstream::stringstream(local_278);
  uVar19 = 0;
  uVar22 = 0;
  edits.
  super__Vector_base<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  do {
    uVar11 = (long)((long)edits.
                          super__Vector_base<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
                          ._M_impl.super__Vector_impl_data._M_start -
                   hunk.hunk_removes_.
                   super__List_base<std::pair<char,_const_char_*>,_std::allocator<std::pair<char,_const_char_*>_>_>
                   ._M_impl._M_node._M_size) >> 2;
    if (uVar11 <= uVar22) break;
    uVar14 = (uVar11 + uVar19) - uVar22;
    pEVar15 = (pointer)((long)edits.
                              super__Vector_base<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage + (uVar11 - uVar22)
                       );
    uVar18 = uVar19;
    uVar21 = uVar22;
    do {
      pEVar16 = edits.
                super__Vector_base<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage;
      uVar19 = uVar18;
      uVar22 = uVar21;
      if (*(int *)(hunk.hunk_removes_.
                   super__List_base<std::pair<char,_const_char_*>,_std::allocator<std::pair<char,_const_char_*>_>_>
                   ._M_impl._M_node._M_size + uVar21 * 4) != 0) break;
      uVar18 = uVar18 + 1;
      edits.
      super__Vector_base<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           (pointer)((long)edits.
                           super__Vector_base<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage + 1);
      uVar21 = uVar21 + 1;
      pEVar16 = pEVar15;
      uVar19 = uVar14;
      uVar22 = uVar11;
    } while (uVar11 != uVar21);
    sVar13 = context;
    if (uVar19 < context) {
      sVar13 = uVar19;
    }
    local_d8 = (undefined1  [8])((uVar19 - sVar13) + 1);
    hunk.left_start_ = (long)pEVar16 + (1 - sVar13);
    hunk.removes_ = 0;
    hunk.right_start_ = 0;
    hunk.adds_ = 0;
    hunk.common_ = (size_t)&hunk.common_;
    hunk.hunk_.
    super__List_base<std::pair<char,_const_char_*>,_std::allocator<std::pair<char,_const_char_*>_>_>
    ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)0x0;
    hunk.hunk_.
    super__List_base<std::pair<char,_const_char_*>,_std::allocator<std::pair<char,_const_char_*>_>_>
    ._M_impl._M_node._M_size =
         (size_t)&hunk.hunk_.
                  super__List_base<std::pair<char,_const_char_*>,_std::allocator<std::pair<char,_const_char_*>_>_>
                  ._M_impl._M_node._M_size;
    hunk.hunk_adds_.
    super__List_base<std::pair<char,_const_char_*>,_std::allocator<std::pair<char,_const_char_*>_>_>
    ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)0x0;
    hunk.hunk_adds_.
    super__List_base<std::pair<char,_const_char_*>,_std::allocator<std::pair<char,_const_char_*>_>_>
    ._M_impl._M_node._M_size =
         (size_t)&hunk.hunk_adds_.
                  super__List_base<std::pair<char,_const_char_*>,_std::allocator<std::pair<char,_const_char_*>_>_>
                  ._M_impl._M_node._M_size;
    hunk.hunk_removes_.
    super__List_base<std::pair<char,_const_char_*>,_std::allocator<std::pair<char,_const_char_*>_>_>
    ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)0x0;
    hunk.hunk_.
    super__List_base<std::pair<char,_const_char_*>,_std::allocator<std::pair<char,_const_char_*>_>_>
    ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)hunk.common_;
    hunk.hunk_adds_.
    super__List_base<std::pair<char,_const_char_*>,_std::allocator<std::pair<char,_const_char_*>_>_>
    ._M_impl._M_node.super__List_node_base._M_next =
         (_List_node_base *)
         hunk.hunk_.
         super__List_base<std::pair<char,_const_char_*>,_std::allocator<std::pair<char,_const_char_*>_>_>
         ._M_impl._M_node._M_size;
    hunk.hunk_removes_.
    super__List_base<std::pair<char,_const_char_*>,_std::allocator<std::pair<char,_const_char_*>_>_>
    ._M_impl._M_node.super__List_node_base._M_next =
         (_List_node_base *)
         hunk.hunk_adds_.
         super__List_base<std::pair<char,_const_char_*>,_std::allocator<std::pair<char,_const_char_*>_>_>
         ._M_impl._M_node._M_size;
    if (sVar13 != 0) {
      lVar20 = uVar19 * 0x20 + sVar13 * -0x20;
      do {
        anon_unknown_1::Hunk::PushLine
                  ((Hunk *)local_d8,' ',
                   *(char **)((long)&(((left->
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       )._M_impl.super__Vector_impl_data._M_start)->_M_dataplus).
                                     _M_p + lVar20));
        lVar20 = lVar20 + 0x20;
        sVar13 = sVar13 - 1;
      } while (sVar13 != 0);
      uVar11 = (long)((long)edits.
                            super__Vector_base<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
                            ._M_impl.super__Vector_impl_data._M_start -
                     hunk.hunk_removes_.
                     super__List_base<std::pair<char,_const_char_*>,_std::allocator<std::pair<char,_const_char_*>_>_>
                     ._M_impl._M_node._M_size) >> 2;
    }
    edits.
    super__Vector_base<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = pEVar16;
    if (uVar22 < uVar11) {
      lVar20 = uVar22 * 4;
      uVar11 = 0;
      do {
        lVar20 = (lVar20 << 0x1e) >> 0x1e;
        if (context <= uVar11) {
          pEVar15 = (pointer)(hunk.hunk_removes_.
                              super__List_base<std::pair<char,_const_char_*>,_std::allocator<std::pair<char,_const_char_*>_>_>
                              ._M_impl._M_node._M_size + (long)(int)uVar22 * 4);
          lVar12 = lVar20;
          while( true ) {
            if (pEVar15 ==
                edits.
                super__Vector_base<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
                ._M_impl.super__Vector_impl_data._M_start) goto LAB_001616a4;
            if (*pEVar15 != kMatch) break;
            pEVar15 = pEVar15 + 1;
            lVar12 = lVar12 + 4;
          }
          if ((pEVar15 ==
               edits.
               super__Vector_base<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
               ._M_impl.super__Vector_impl_data._M_start) || (context <= (lVar12 >> 2) - uVar22))
          break;
        }
        uVar1 = *(uint *)(hunk.hunk_removes_.
                          super__List_base<std::pair<char,_const_char_*>,_std::allocator<std::pair<char,_const_char_*>_>_>
                          ._M_impl._M_node._M_size + uVar22 * 4);
        uVar11 = uVar11 + 1;
        if (uVar1 != 0) {
          uVar11 = 0;
        }
        if ((uVar1 < 4) && (uVar1 != 1)) {
          edit = '-';
          if (uVar1 == 0) {
            edit = ' ';
          }
          anon_unknown_1::Hunk::PushLine
                    ((Hunk *)local_d8,edit,
                     (left->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start[uVar19]._M_dataplus._M_p);
        }
        if ((uVar1 & 0xfffffffd) == 1) {
          p_Var2 = *(_List_node_base **)
                    (*(long *)ss._384_8_ +
                    (long)edits.
                          super__Vector_base<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage * 0x20);
          hunk.right_start_ = hunk.right_start_ + 1;
          p_Var8 = (_List_node_base *)operator_new(0x20);
          *(undefined1 *)&p_Var8[1]._M_next = 0x2b;
          p_Var8[1]._M_prev = p_Var2;
          std::__detail::_List_node_base::_M_hook(p_Var8);
          hunk.hunk_adds_.
          super__List_base<std::pair<char,_const_char_*>,_std::allocator<std::pair<char,_const_char_*>_>_>
          ._M_impl._M_node.super__List_node_base._M_prev =
               (_List_node_base *)
               ((long)&(hunk.hunk_adds_.
                        super__List_base<std::pair<char,_const_char_*>,_std::allocator<std::pair<char,_const_char_*>_>_>
                        ._M_impl._M_node.super__List_node_base._M_prev)->_M_next + 1);
        }
        uVar19 = uVar19 + (uVar1 != 1);
        edits.
        super__Vector_base<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             (pointer)((long)edits.
                             super__Vector_base<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage +
                      (ulong)(uVar1 != 2));
        uVar22 = uVar22 + 1;
        lVar20 = lVar20 + 4;
      } while (uVar22 < (ulong)((long)((long)edits.
                                             super__Vector_base<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
                                             ._M_impl.super__Vector_impl_data._M_start -
                                      hunk.hunk_removes_.
                                      super__List_base<std::pair<char,_const_char_*>,_std::allocator<std::pair<char,_const_char_*>_>_>
                                      ._M_impl._M_node._M_size) >> 2));
    }
LAB_001616a4:
    bVar5 = hunk.adds_ != 0;
    bVar6 = hunk.right_start_ != 0;
    if (bVar5 || bVar6) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss.field_0x8,"@@ ",3);
      if (hunk.adds_ != 0) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss.field_0x8,"-",1);
        poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)&ss.field_0x8);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,",",1);
        std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
        if (hunk.right_start_ != 0 && hunk.adds_ != 0) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss.field_0x8," ",1);
        }
      }
      if (hunk.right_start_ != 0) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss.field_0x8,"+",1);
        poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)&ss.field_0x8);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,",",1);
        std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss.field_0x8," @@\n",4);
      anon_unknown_1::Hunk::FlushEdits((Hunk *)local_d8);
      plVar17 = (long *)hunk.common_;
      if ((size_t *)hunk.common_ != &hunk.common_) {
        do {
          local_31 = (char)plVar17[2];
          poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&ss.field_0x8,&local_31,1);
          __s = (char *)plVar17[3];
          if (__s == (char *)0x0) {
            std::ios::clear((int)poVar9 + (int)poVar9->_vptr_basic_ostream[-3]);
          }
          else {
            sVar10 = strlen(__s);
            std::__ostream_insert<char,std::char_traits<char>>(poVar9,__s,sVar10);
          }
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
          plVar17 = (long *)*plVar17;
        } while ((size_t *)plVar17 != &hunk.common_);
      }
    }
    puVar7 = (undefined8 *)
             hunk.hunk_adds_.
             super__List_base<std::pair<char,_const_char_*>,_std::allocator<std::pair<char,_const_char_*>_>_>
             ._M_impl._M_node._M_size;
    while (puVar7 != &hunk.hunk_adds_.
                      super__List_base<std::pair<char,_const_char_*>,_std::allocator<std::pair<char,_const_char_*>_>_>
                      ._M_impl._M_node._M_size) {
      puVar3 = (undefined8 *)*puVar7;
      operator_delete(puVar7,0x20);
      puVar7 = puVar3;
    }
    puVar7 = (undefined8 *)
             hunk.hunk_.
             super__List_base<std::pair<char,_const_char_*>,_std::allocator<std::pair<char,_const_char_*>_>_>
             ._M_impl._M_node._M_size;
    while (puVar7 != &hunk.hunk_.
                      super__List_base<std::pair<char,_const_char_*>,_std::allocator<std::pair<char,_const_char_*>_>_>
                      ._M_impl._M_node._M_size) {
      puVar3 = (undefined8 *)*puVar7;
      operator_delete(puVar7,0x20);
      puVar7 = puVar3;
    }
    plVar17 = (long *)hunk.common_;
    if ((size_t *)hunk.common_ != &hunk.common_) {
      do {
        plVar4 = (long *)*plVar17;
        operator_delete(plVar17,0x20);
        plVar17 = plVar4;
      } while ((size_t *)plVar4 != &hunk.common_);
    }
  } while (bVar5 || bVar6);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_278);
  std::ios_base::~ios_base((ios_base *)&ss.field_0x78);
  if (hunk.hunk_removes_.
      super__List_base<std::pair<char,_const_char_*>,_std::allocator<std::pair<char,_const_char_*>_>_>
      ._M_impl._M_node._M_size != 0) {
    operator_delete((void *)hunk.hunk_removes_.
                            super__List_base<std::pair<char,_const_char_*>,_std::allocator<std::pair<char,_const_char_*>_>_>
                            ._M_impl._M_node._M_size,
                    (long)edits.
                          super__Vector_base<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    hunk.hunk_removes_.
                    super__List_base<std::pair<char,_const_char_*>,_std::allocator<std::pair<char,_const_char_*>_>_>
                    ._M_impl._M_node._M_size);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string CreateUnifiedDiff(const std::vector<std::string>& left,
                              const std::vector<std::string>& right,
                              size_t context) {
  const std::vector<EditType> edits = CalculateOptimalEdits(left, right);

  size_t l_i = 0, r_i = 0, edit_i = 0;
  std::stringstream ss;
  while (edit_i < edits.size()) {
    // Find first edit.
    while (edit_i < edits.size() && edits[edit_i] == kMatch) {
      ++l_i;
      ++r_i;
      ++edit_i;
    }

    // Find the first line to include in the hunk.
    const size_t prefix_context = std::min(l_i, context);
    Hunk hunk(l_i - prefix_context + 1, r_i - prefix_context + 1);
    for (size_t i = prefix_context; i > 0; --i) {
      hunk.PushLine(' ', left[l_i - i].c_str());
    }

    // Iterate the edits until we found enough suffix for the hunk or the input
    // is over.
    size_t n_suffix = 0;
    for (; edit_i < edits.size(); ++edit_i) {
      if (n_suffix >= context) {
        // Continue only if the next hunk is very close.
        auto it = edits.begin() + static_cast<int>(edit_i);
        while (it != edits.end() && *it == kMatch) ++it;
        if (it == edits.end() ||
            static_cast<size_t>(it - edits.begin()) - edit_i >= context) {
          // There is no next edit or it is too far away.
          break;
        }
      }

      EditType edit = edits[edit_i];
      // Reset count when a non match is found.
      n_suffix = edit == kMatch ? n_suffix + 1 : 0;

      if (edit == kMatch || edit == kRemove || edit == kReplace) {
        hunk.PushLine(edit == kMatch ? ' ' : '-', left[l_i].c_str());
      }
      if (edit == kAdd || edit == kReplace) {
        hunk.PushLine('+', right[r_i].c_str());
      }

      // Advance indices, depending on edit type.
      l_i += edit != kAdd;
      r_i += edit != kRemove;
    }

    if (!hunk.has_edits()) {
      // We are done. We don't want this hunk.
      break;
    }

    hunk.PrintTo(&ss);
  }
  return ss.str();
}